

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEException.cpp
# Opt level: O2

bool __thiscall test_CEException::test_construct(test_CEException *this)

{
  invalid_value *this_00;
  string msg2;
  string test_trace;
  string test_msg;
  string test_what;
  string msg;
  allocator local_e8 [32];
  string local_c8 [4];
  string local_48;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"Testing throwing \'CEException::invalid_value\'",
             (allocator *)local_c8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_c8);
  this_00 = (invalid_value *)__cxa_allocate_exception(0xa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_c8,"test_CEException::test_invalid_value()",local_e8)
  ;
  CEException::invalid_value::invalid_value(this_00,local_c8,&local_48);
  __cxa_throw(this_00,&CEException::invalid_value::typeinfo,CEExceptionHandler::~CEExceptionHandler)
  ;
}

Assistant:

bool test_CEException::test_construct(void)
{
    // Create a message
    std::string msg = "Testing throwing 'CEException::invalid_value'";

    // Try throwing
    try {
        throw CEException::invalid_value("test_CEException::test_invalid_value()",
                                         msg);
        // If we get here there's a problem
        log_failure("CEException::invalid_value failed to throw", __func__, __LINE__);
        update_pass(false);
    } catch (CEException::invalid_value & e) {
        // This is where we should be
        log_success("CEException::invalid_value thrown successfully", __func__, __LINE__);
        update_pass(true);

        // Test that we can access the message
        std::string test_msg(e.message());
        test_string(test_msg, msg, __func__, __LINE__);

        // Test that the backtrace is in fact filled
        std::string test_trace(e.trace());
        test_greaterthan(test_trace.size(), 1, __func__, __LINE__);

        // Make sure the combined output exceeds both the message and trace
        std::string test_what(e.what());
        test_greaterthan(test_what.size(), test_msg.size()+test_trace.size(), __func__, __LINE__);

        // See if we can append to the exception
        std::string msg2(" ... now with more text!");
        e.message_append(msg2);
        test_msg = std::string(e.message());
        test_string(test_msg, msg+msg2, __func__, __LINE__);
    }

    return pass();
}